

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

ProgramCacheResult __thiscall
QRhiGles2::tryLoadFromDiskOrPipelineCache
          (QRhiGles2 *this,QRhiShaderStage *stages,int stageCount,GLuint program,
          QVector<QShaderDescription::InOutVariable> *inputVars,QByteArray *cacheKey)

{
  byte bVar1;
  Data *pDVar2;
  qsizetype qVar3;
  Span *pSVar4;
  Entry *pEVar5;
  Data *pDVar6;
  bool bVar7;
  int iVar8;
  _Rb_tree_node_base *p_Var9;
  ulong uVar10;
  QOpenGLProgramBinaryCache *this_00;
  QLoggingCategory *pQVar11;
  Type TVar12;
  char *pcVar13;
  ulong uVar14;
  undefined8 *puVar15;
  ProgramCacheResult PVar16;
  long lVar17;
  _Rb_tree_node_base *p_Var18;
  QArrayDataPointer<char> *this_01;
  InOutVariable *var;
  InOutVariable *key;
  QRhiShaderStage *shaderStage;
  long in_FS_OFFSET;
  bool bVar19;
  const_iterator cVar20;
  QVector<QShaderDescription::InOutVariable> *__range4;
  GLint linkStatus;
  undefined4 uStack_b4;
  QArrayDataPointer<char> QStack_b0;
  QArrayDataPointer<char> local_98;
  QMap<QByteArray,_int> local_80;
  QArrayDataPointer<char> local_78;
  QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar7 = isProgramBinaryDiskCacheEnabled(this);
  if ((((this->caps).field_0x3b & 0x40) == 0) ||
     (pDVar2 = (this->m_pipelineCache).d, pDVar2 == (Data *)0x0)) {
    bVar19 = false;
  }
  else {
    bVar19 = pDVar2->size != 0;
  }
  if ((bVar7 | bVar19) == 1) {
    local_58.size = 0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (ShaderDesc *)0x0;
    uVar10 = 0;
    uVar14 = (ulong)(uint)stageCount;
    if (stageCount < 1) {
      uVar14 = uVar10;
    }
    for (; uVar10 != uVar14; uVar10 = uVar10 + 1) {
      shaderStage = stages + uVar10;
      local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.ptr = &DAT_aaaaaaaaaaaaaaaa;
      shaderSource((QByteArray *)&local_78,this,shaderStage,(QShaderVersion *)0x0);
      if ((char *)local_78.size == (char *)0x0) {
        QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
        PVar16 = ProgramCacheError;
        bVar19 = false;
        goto LAB_004e6529;
      }
      TVar12 = shaderStage->m_type;
      if (TVar12 == Vertex) {
        local_80.d.d.ptr =
             (QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
              )(totally_ordered_wrapper<QMapData<std::map<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_*>
                )0x0;
        key = (inputVars->d).ptr;
        for (lVar17 = (inputVars->d).size * 0x68; lVar17 != 0; lVar17 = lVar17 + -0x68) {
          QMap<QByteArray,_int>::insert(&local_80,&key->name,&key->location);
          key = key + 1;
        }
        local_98.d = (Data *)0x0;
        local_98.ptr = (char *)0x0;
        linkStatus = 0;
        uStack_b4 = 0;
        QStack_b0.d._0_4_ = 0x606337;
        QStack_b0.d._4_4_ = 0;
        local_98.size = 0;
        QStack_b0.ptr._0_4_ = 5;
        QStack_b0.ptr._4_4_ = 0;
        QByteArray::append((QByteArray *)&local_78);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&linkStatus);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
        if (local_80.d.d.ptr ==
            (totally_ordered_wrapper<QMapData<std::map<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_*>
             )0x0) {
          p_Var9 = (_Rb_tree_node_base *)0x0;
        }
        else {
          p_Var9 = *(_Base_ptr *)((long)local_80.d.d.ptr + 0x20);
        }
        p_Var18 = (_Rb_tree_node_base *)((long)local_80.d.d.ptr + 0x10);
        if (local_80.d.d.ptr ==
            (totally_ordered_wrapper<QMapData<std::map<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_*>
             )0x0) {
          p_Var18 = (_Rb_tree_node_base *)0x0;
        }
        for (; p_Var9 != p_Var18; p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
          QByteArray::append((QByteArray *)&local_78);
          QByteArray::number((int)(ShaderDesc *)&linkStatus,*(int *)&p_Var9[1]._M_right);
          QByteArray::append((QByteArray *)&local_78);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&linkStatus);
        }
        local_98.d = (Data *)0x0;
        local_98.ptr = (char *)0x0;
        linkStatus = 0;
        uStack_b4 = 0;
        QStack_b0.d._0_4_ = 0x5c6f58;
        QStack_b0.d._4_4_ = 0;
        local_98.size = 0;
        QStack_b0.ptr._0_4_ = 1;
        QStack_b0.ptr._4_4_ = 0;
        QByteArray::append((QByteArray *)&local_78);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&linkStatus);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&local_80.d);
        TVar12 = shaderStage->m_type;
      }
      QStack_b0.d._0_4_ = SUB84(local_78.d,0);
      QStack_b0.d._4_4_ = (undefined4)((ulong)local_78.d >> 0x20);
      QStack_b0.ptr._0_4_ = SUB84(local_78.ptr,0);
      QStack_b0.ptr._4_4_ = (undefined4)((ulong)local_78.ptr >> 0x20);
      QStack_b0.size = local_78.size;
      if (local_78.d != (Data *)0x0) {
        LOCK();
        ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      linkStatus = TVar12;
      QList<QOpenGLProgramBinaryCache::ShaderDesc>::
      emplaceBack<QOpenGLProgramBinaryCache::ShaderDesc>
                ((QList<QOpenGLProgramBinaryCache::ShaderDesc> *)&local_58,(ShaderDesc *)&linkStatus
                );
      QArrayDataPointer<char>::~QArrayDataPointer(&QStack_b0);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
    }
    this_01 = (QArrayDataPointer<char> *)&linkStatus;
    QOpenGLProgramBinaryCache::ProgramDesc::cacheKey((QByteArray *)this_01,(ProgramDesc *)&local_58)
    ;
    pDVar6 = (cacheKey->d).d;
    pcVar13 = (cacheKey->d).ptr;
    (cacheKey->d).d = (Data *)CONCAT44(uStack_b4,linkStatus);
    (cacheKey->d).ptr = (char *)CONCAT44(QStack_b0.d._4_4_,QStack_b0.d._0_4_);
    linkStatus = (GLint)pDVar6;
    uStack_b4 = (undefined4)((ulong)pDVar6 >> 0x20);
    QStack_b0.d._0_4_ = SUB84(pcVar13,0);
    QStack_b0.d._4_4_ = (undefined4)((ulong)pcVar13 >> 0x20);
    qVar3 = (cacheKey->d).size;
    (cacheKey->d).size = CONCAT44(QStack_b0.ptr._4_4_,QStack_b0.ptr._0_4_);
    QStack_b0.ptr._0_4_ = (undefined4)qVar3;
    QStack_b0.ptr._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
    QArrayDataPointer<char>::~QArrayDataPointer(this_01);
    if (bVar19 == false) {
LAB_004e648e:
      if (bVar7) {
LAB_004e6499:
        this_00 = (QOpenGLProgramBinaryCache *)
                  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qrhi_programBinaryCache>_>
                  ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qrhi_programBinaryCache>_>
                                *)this_01);
        bVar7 = QOpenGLProgramBinaryCache::load(this_00,cacheKey,program);
        if (bVar7) {
          pQVar11 = QtPrivateLogging::lcOpenGLProgramDiskCache();
          bVar19 = false;
          PVar16 = ProgramCacheHit;
          if (((pQVar11->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
            QStack_b0.size = (qsizetype)pQVar11->name;
            linkStatus = 2;
            QStack_b0.ptr._4_4_ = 0;
            uStack_b4 = 0;
            QStack_b0.d._0_4_ = 0;
            QStack_b0.d._4_4_ = 0;
            QStack_b0.ptr._0_4_ = 0;
            pcVar13 = (cacheKey->d).ptr;
            if (pcVar13 == (char *)0x0) {
              pcVar13 = (char *)&QByteArray::_empty;
            }
            bVar19 = false;
            QMessageLogger::debug
                      ((char *)&linkStatus,"Program binary received from cache, program %u, key %s",
                       (ulong)program,pcVar13);
            PVar16 = ProgramCacheHit;
          }
          goto LAB_004e6529;
        }
      }
      PVar16 = ProgramCacheError;
      bVar19 = true;
    }
    else {
      this_01 = (QArrayDataPointer<char> *)&this->m_pipelineCache;
      cVar20 = QHash<QByteArray,_QRhiGles2::PipelineCacheData>::constFindImpl<QByteArray>
                         ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)this_01,cacheKey);
      if (cVar20.i.d == (Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> *)0x0
          && cVar20.i.bucket == 0) goto LAB_004e648e;
      do {
        iVar8 = (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
                  functions[0x17])();
        if (iVar8 == 0x507) break;
      } while (iVar8 != 0);
      pSVar4 = (cVar20.i.d)->spans;
      uVar14 = cVar20.i.bucket >> 7;
      pEVar5 = pSVar4[uVar14].entries;
      bVar1 = pSVar4[uVar14].offsets[(uint)cVar20.i.bucket & 0x7f];
      puVar15 = *(undefined8 **)(pEVar5[bVar1].storage.data + 0x28);
      if (puVar15 == (undefined8 *)0x0) {
        puVar15 = &QByteArray::_empty;
      }
      this_01 = (QArrayDataPointer<char> *)(ulong)program;
      (*(this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr[1].field_0.functions
        [0x61])(this_01,(ulong)*(uint *)(pEVar5[bVar1].storage.data + 0x18),puVar15,
                (ulong)*(uint *)(pEVar5[bVar1].storage.data + 0x30));
      iVar8 = (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
                functions[0x17])();
      if (iVar8 != 0) goto LAB_004e648e;
      linkStatus = 0;
      this_01 = (QArrayDataPointer<char> *)(ulong)program;
      (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
        [0x55])(this_01,0x8b82,&linkStatus);
      bVar19 = linkStatus != 1;
      if (bVar7 && bVar19) goto LAB_004e6499;
      PVar16 = (uint)bVar19 * 2;
    }
LAB_004e6529:
    QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>::~QArrayDataPointer(&local_58);
    if (!bVar19) goto LAB_004e653e;
  }
  PVar16 = ProgramCacheMiss;
LAB_004e653e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return PVar16;
}

Assistant:

QRhiGles2::ProgramCacheResult QRhiGles2::tryLoadFromDiskOrPipelineCache(const QRhiShaderStage *stages,
                                                                        int stageCount,
                                                                        GLuint program,
                                                                        const QVector<QShaderDescription::InOutVariable> &inputVars,
                                                                        QByteArray *cacheKey)
{
    Q_ASSERT(cacheKey);

    // the traditional QOpenGL disk cache since Qt 5.9
    const bool legacyDiskCacheEnabled = isProgramBinaryDiskCacheEnabled();

    // QRhi's own (set)PipelineCacheData()
    const bool pipelineCacheEnabled = caps.programBinary && !m_pipelineCache.isEmpty();

    // calculating the cache key based on the source code is common for both types of caches
    if (legacyDiskCacheEnabled || pipelineCacheEnabled) {
        QOpenGLProgramBinaryCache::ProgramDesc binaryProgram;
        for (int i = 0; i < stageCount; ++i) {
            const QRhiShaderStage &stage(stages[i]);
            QByteArray source = shaderSource(stage, nullptr);
            if (source.isEmpty())
                return QRhiGles2::ProgramCacheError;

            if (stage.type() == QRhiShaderStage::Vertex) {
                // Now add something to the key that indicates the vertex input locations.
                // A GLSL shader lower than 330 (150, 140, ...) will not have location
                // qualifiers. This means that the shader source code is the same
                // regardless of what locations inputVars contains. This becomes a problem
                // because we'll glBindAttribLocation the shader based on inputVars, but
                // that's only when compiling/linking when there was no cache hit. Picking
                // from the cache afterwards should take the input locations into account
                // since if inputVars has now different locations for the attributes, then
                // it is not ok to reuse a program binary that used different attribute
                // locations. For a lot of clients this would not be an issue since they
                // typically hardcode and use the same vertex locations on every run. Some
                // systems that dynamically generate shaders may end up with a non-stable
                // order (and so location numbers), however. This is sub-optimal because
                // it makes caching inefficient, and said clients should be fixed, but in
                // any case this should not break rendering. Hence including the locations
                // in the cache key.
                QMap<QByteArray, int> inputLocations; // sorted by key when iterating
                for (const QShaderDescription::InOutVariable &var : inputVars)
                    inputLocations.insert(var.name, var.location);
                source += QByteArrayLiteral("\n // "); // just to be nice; treated as an arbitrary string regardless
                for (auto it = inputLocations.cbegin(), end = inputLocations.cend(); it != end; ++it) {
                    source += it.key();
                    source += QByteArray::number(it.value());
                }
                source += QByteArrayLiteral("\n");
            }

            binaryProgram.shaders.append(QOpenGLProgramBinaryCache::ShaderDesc(toShaderStage(stage.type()), source));
        }

        *cacheKey = binaryProgram.cacheKey();

        // Try our pipeline cache simulation first, if it got seeded with
        // setPipelineCacheData and there's a hit, then no need to go to the
        // filesystem at all.
        if (pipelineCacheEnabled) {
            auto it = m_pipelineCache.constFind(*cacheKey);
            if (it != m_pipelineCache.constEnd()) {
                GLenum err;
                for ( ; ; ) {
                    err = f->glGetError();
                    if (err == GL_NO_ERROR || err == GL_CONTEXT_LOST)
                        break;
                }
                f->glProgramBinary(program, it->format, it->data.constData(), it->data.size());
                err = f->glGetError();
                if (err == GL_NO_ERROR) {
                    GLint linkStatus = 0;
                    f->glGetProgramiv(program, GL_LINK_STATUS, &linkStatus);
                    if (linkStatus == GL_TRUE)
                        return QRhiGles2::ProgramCacheHit;
                }
            }
        }

        if (legacyDiskCacheEnabled && qrhi_programBinaryCache()->load(*cacheKey, program)) {
            // use the logging category QOpenGLShaderProgram would
            qCDebug(lcOpenGLProgramDiskCache, "Program binary received from cache, program %u, key %s",
                    program, cacheKey->constData());
            return QRhiGles2::ProgramCacheHit;
        }
    }

    return QRhiGles2::ProgramCacheMiss;
}